

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.inl
# Opt level: O0

buffer_reader * operator>>(buffer_reader *reader,webots_velocity_message *message)

{
  message_id mVar1;
  message_id mVar2;
  ssize_t sVar3;
  ostream *poVar4;
  void *pvVar5;
  runtime_error *this;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  void *in_RDX;
  void *__buf;
  int __fd;
  string local_1e0 [48];
  stringstream local_1b0 [8];
  stringstream stream;
  ostream local_1a0;
  message_header local_25;
  ssize_t sStack_20;
  message_header header;
  size_t read;
  webots_velocity_message *message_local;
  buffer_reader *reader_local;
  message_header *header_00;
  
  sStack_20 = buffer_reader::read(reader,(int)message,in_RDX,CONCAT71(in_register_00000009,in_CL));
  header_00 = &local_25;
  operator>>(reader,header_00);
  mVar2 = local_25.id;
  __fd = (int)header_00;
  mVar1 = basic_message<webots_velocity_message,_(message_id)129>::id
                    ((basic_message<webots_velocity_message,_(message_id)129> *)message);
  if (mVar2 != mVar1) {
    sVar3 = buffer_reader::read(reader,__fd,__buf,CONCAT71(in_register_00000009,mVar1));
    buffer_reader::unwind(reader,sVar3 - sStack_20);
    std::__cxx11::stringstream::stringstream(local_1b0);
    poVar4 = std::operator<<(&local_1a0,"Message ids do not match");
    poVar4 = std::operator<<(poVar4," (");
    pvVar5 = (void *)std::ostream::operator<<(poVar4,std::hex);
    poVar4 = (ostream *)std::ostream::operator<<(pvVar5,(uint)local_25.id);
    poVar4 = std::operator<<(poVar4," instead of ");
    pvVar5 = (void *)std::ostream::operator<<(poVar4,std::hex);
    mVar2 = basic_message<webots_velocity_message,_(message_id)129>::id
                      ((basic_message<webots_velocity_message,_(message_id)129> *)message);
    poVar4 = (ostream *)std::ostream::operator<<(pvVar5,(uint)mVar2);
    std::operator<<(poVar4,")");
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    std::runtime_error::runtime_error(this,local_1e0);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  basic_message<webots_velocity_message,_(message_id)129>::read_body
            ((basic_message<webots_velocity_message,_(message_id)129> *)message,reader);
  return reader;
}

Assistant:

inline buffer_reader& operator>>(buffer_reader& reader, T& message)
{
    std::size_t read = reader.read();
    message_header header;
    reader >> header;

    if(header.id != message.id())
    {
        reader.unwind(reader.read() - read);
        std::stringstream stream;
        stream << "Message ids do not match"
               << " (" << std::hex << static_cast<int>(header.id) << " instead of " << std::hex << static_cast<int>(message.id()) << ")";

        throw std::runtime_error(stream.str());
    }

    message.read_body(reader);

    return reader;
}